

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void btreeReleaseAllCursorPages(BtCursor *pCur)

{
  char cVar1;
  long lVar2;
  
  cVar1 = pCur->iPage;
  if (-1 < cVar1) {
    for (lVar2 = 0; lVar2 < cVar1; lVar2 = lVar2 + 1) {
      releasePageNotNull(pCur->apPage[lVar2]);
      cVar1 = pCur->iPage;
    }
    releasePageNotNull(pCur->pPage);
    pCur->iPage = -1;
  }
  return;
}

Assistant:

static void btreeReleaseAllCursorPages(BtCursor *pCur){
  int i;
  if( pCur->iPage>=0 ){
    for(i=0; i<pCur->iPage; i++){
      releasePageNotNull(pCur->apPage[i]);
    }
    releasePageNotNull(pCur->pPage);
    pCur->iPage = -1;
  }
}